

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O1

l2_expr_info *
l2_eval_expr_logic_and1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_expr_info left_expr_info_01;
  boolean bVar1;
  l2_token *plVar2;
  int cols;
  int lines;
  l2_parsing_error_type error_type;
  l2_expr_info new_left_expr_info;
  l2_expr_info local_58;
  l2_expr_info local_40;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LOGIC_AND);
  if (bVar1 == '\0') {
    (__return_storage_ptr__->val).procedure.upper_scope_p =
         left_expr_info.val.procedure.upper_scope_p;
    *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
    (__return_storage_ptr__->val).integer = left_expr_info.val._0_8_;
    return __return_storage_ptr__;
  }
  l2_parse_token_forward();
  plVar2 = l2_parse_token_current();
  l2_eval_expr_bit_xor(&local_58,scope_p);
  left_expr_info_00._4_4_ = local_58._4_4_;
  left_expr_info_00.val_type = local_58.val_type;
  left_expr_info_00.val.integer._1_7_ = local_58.val.integer._1_7_;
  left_expr_info_00.val.bool = local_58.val.bool;
  left_expr_info_00.val.procedure.upper_scope_p = local_58.val.procedure.upper_scope_p;
  l2_eval_expr_bit_or1(&local_40,scope_p,left_expr_info_00);
  if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
    if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
      local_58.val_type = L2_EXPR_VAL_TYPE_BOOL;
      local_58.val.bool = local_40.val.bool != '\0' && left_expr_info.val.bool != '\0';
      left_expr_info_01._4_4_ = local_58._4_4_;
      left_expr_info_01.val_type = 4;
      left_expr_info_01.val.integer._1_7_ = local_58.val.integer._1_7_;
      left_expr_info_01.val.bool = local_58.val.bool;
      left_expr_info_01.val.procedure.upper_scope_p = local_58.val.procedure.upper_scope_p;
      l2_eval_expr_logic_and1(__return_storage_ptr__,scope_p,left_expr_info_01);
      return __return_storage_ptr__;
    }
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    error_type = L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE;
  }
  else {
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    error_type = L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE;
  }
  l2_parsing_error(error_type,lines,cols,"&&");
}

Assistant:

l2_expr_info l2_eval_expr_logic_and1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p
    _if_type (L2_TOKEN_LOGIC_AND)
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_bit_or(scope_p);
        _if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            _if (right_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
                new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
                new_left_expr_info.val.bool = (left_expr_info.val.bool && right_expr_info.val.bool);
                return l2_eval_expr_logic_and1(scope_p, new_left_expr_info);

            } _throw_right_expr_not_bool("&&")

        } _throw_left_expr_not_bool("&&")

    }
    _else
    {
        return left_expr_info;
    }
}